

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

TProb<double> * __thiscall libDAI::TProb<double>::operator^=(TProb<double> *this,Real a)

{
  pointer pdVar1;
  ulong uVar2;
  double dVar3;
  
  if ((a != 1.0) || (NAN(a))) {
    pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar2 = 0;
        uVar2 < (ulong)((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
        uVar2 = uVar2 + 1) {
      dVar3 = pow(pdVar1[uVar2],a);
      pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1[uVar2] = dVar3;
    }
  }
  return this;
}

Assistant:

TProb<T>& operator^= (Real a) {
                if( a != 1.0 ) {
                    for( size_t i = 0; i < size(); i++ )
                        _p[i] = std::pow( _p[i], a );
                }
                return *this;
            }